

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O0

Status leveldb::DoWriteStringToFile(Env *env,Slice *data,string *fname,bool should_sync)

{
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  Status *in_RDI;
  byte in_R8B;
  WritableFile *file;
  Status *s;
  Status *in_stack_ffffffffffffff88;
  Status *in_stack_ffffffffffffff90;
  Status *this;
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  undefined1 local_40 [15];
  undefined1 local_31;
  Status *local_30;
  byte local_21;
  undefined8 local_20;
  undefined8 local_18;
  long *local_10;
  
  local_21 = in_R8B & 1;
  local_31 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0x20))(in_RDI,in_RSI,in_RCX,&local_30);
  bVar1 = Status::ok(in_RDI);
  if (bVar1) {
    (**(code **)(local_30->state_ + 0x10))(local_40,local_30,local_18);
    Status::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    Status::~Status(in_stack_ffffffffffffff90);
    bVar1 = Status::ok(in_RDI);
    if ((bVar1) && ((local_21 & 1) != 0)) {
      (**(code **)(local_30->state_ + 0x28))(local_48);
      Status::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      Status::~Status(in_stack_ffffffffffffff90);
    }
    bVar1 = Status::ok(in_RDI);
    if (bVar1) {
      (**(code **)(local_30->state_ + 0x18))(local_50);
      Status::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      Status::~Status(in_stack_ffffffffffffff90);
    }
    this = local_30;
    if (local_30 != (Status *)0x0) {
      (**(code **)(local_30->state_ + 8))();
      this = local_30;
    }
    bVar1 = Status::ok(in_RDI);
    if (!bVar1) {
      (**(code **)(*local_10 + 0x40))(local_58,local_10,local_20);
      Status::~Status(this);
    }
  }
  return (Status)(char *)in_RDI;
}

Assistant:

static Status DoWriteStringToFile(Env* env, const Slice& data,
                                  const std::string& fname, bool should_sync) {
  WritableFile* file;
  Status s = env->NewWritableFile(fname, &file);
  if (!s.ok()) {
    return s;
  }
  s = file->Append(data);
  if (s.ok() && should_sync) {
    s = file->Sync();
  }
  if (s.ok()) {
    s = file->Close();
  }
  delete file;  // Will auto-close if we did not close above
  if (!s.ok()) {
    env->DeleteFile(fname);
  }
  return s;
}